

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Vec3To(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  double *pdVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  AActor *other;
  char *pcVar5;
  AActor *this;
  bool bVar6;
  DVector3 u;
  DVector3 local_48;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0043566b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00435652:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043566b:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_0043554e;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar4 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar4) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043566b;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00435652;
LAB_0043554e:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00435693;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0043565b:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00435693;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00435581;
  }
  else {
    if (other != (AActor *)0x0) goto LAB_0043565b;
LAB_00435581:
    NullParam("\"t\"");
    other = (AActor *)param[1].field_0.field_1.a;
    if (other == (AActor *)0x0) {
      other = (AActor *)0x0;
      goto LAB_004355fc;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  pPVar4 = (other->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
    pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
    (other->super_DThinker).super_DObject.Class = pPVar4;
  }
  bVar6 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar3 && bVar6) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar6 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar3) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar6) {
    pcVar5 = "t == NULL || t->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00435693:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e50,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004355fc:
  AActor::Vec3To(&local_48,this,other);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e51,
                    "int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\x11') {
      __assert_fail("RegType == (REGT_FLOAT | REGT_MULTIREG3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x150,"void VMReturn::SetVector(const DVector3 &)");
    }
    pdVar1 = (double *)ret->Location;
    *pdVar1 = local_48.X;
    pdVar1[1] = local_48.Y;
    pdVar1[2] = local_48.Z;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec3To)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(t, AActor)
	ACTION_RETURN_VEC3(self->Vec3To(t));
}